

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srtStreamReader.cpp
# Opt level: O3

bool __thiscall
SRTStreamReader::detectSrcFormat(SRTStreamReader *this,uint8_t *dataStart,size_t len,int *prefixLen)

{
  uint8_t uVar1;
  Boolean BVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  
  *prefixLen = 0;
  if (len < 4) goto LAB_001cdfae;
  if (((*dataStart != 0xef) || (dataStart[1] != 0xbb)) || (dataStart[2] != 0xbf)) {
    BVar2 = convertUTF::isLegalUTF8String(dataStart,len);
    if (!BVar2) {
      uVar1 = *dataStart;
      if (uVar1 == 0xff) {
        if (dataStart[1] == 0xfe) {
          if ((dataStart[2] != '\0') || (dataStart[3] != '\0')) {
            this->m_srcFormat = sfUTF16le;
            this->m_charSize = 2;
            *prefixLen = 2;
            uVar3 = my_ntohs(0xa00);
            this->m_short_N = uVar3;
            uVar3 = 0xd00;
            goto LAB_001cdf4b;
          }
          this->m_srcFormat = sfUTF32le;
          this->m_charSize = 4;
          *prefixLen = 4;
          uVar4 = my_ntohl(0xa000000);
          this->m_long_N = uVar4;
          uVar4 = 0xd000000;
LAB_001cdfe7:
          uVar4 = my_ntohl(uVar4);
          this->m_long_R = uVar4;
          goto LAB_001cdfae;
        }
      }
      else if (uVar1 == 0xfe) {
        if (dataStart[1] == 0xff) {
          this->m_srcFormat = sfUTF16be;
          this->m_charSize = 2;
          *prefixLen = 2;
          this->m_splitterOfs = 1;
          uVar3 = my_ntohs(10);
          this->m_short_N = uVar3;
          uVar3 = 0xd;
LAB_001cdf4b:
          uVar3 = my_ntohs(uVar3);
          this->m_short_R = uVar3;
          goto LAB_001cdfae;
        }
      }
      else if (((uVar1 == '\0') && (dataStart[1] == '\0')) &&
              ((dataStart[2] == 0xfe && (dataStart[3] == 0xff)))) {
        this->m_srcFormat = sfUTF32be;
        this->m_charSize = 4;
        *prefixLen = 4;
        this->m_splitterOfs = 3;
        uVar4 = my_ntohl(10);
        this->m_long_N = uVar4;
        uVar4 = 0xd;
        goto LAB_001cdfe7;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Failed to auto-detect SRT encoding : falling back to UTF-8",
                 0x3a);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      sLastMsg = true;
      this->m_srcFormat = sfUTF8;
      goto LAB_001cdfae;
    }
  }
  this->m_charSize = 1;
  this->m_srcFormat = sfUTF8;
  *prefixLen = 3;
LAB_001cdfae:
  return 3 < len;
}

Assistant:

bool SRTStreamReader::detectSrcFormat(const uint8_t* dataStart, const size_t len, int& prefixLen)
{
    prefixLen = 0;
    if (len < 4)
        return false;
    // detect UTF-8/UTF-16/UTF-32 format
    if ((dataStart[0] == 0xEF && dataStart[1] == 0xBB && dataStart[2] == 0xBF) ||
        convertUTF::isLegalUTF8String(dataStart, len))
    {
        m_charSize = 1;
        m_srcFormat = UtfConverter::SourceFormat::sfUTF8;
        prefixLen = 3;
    }
    else if (dataStart[0] == 0 && dataStart[1] == 0 && dataStart[2] == 0xFE && dataStart[3] == 0xFF)
    {
        m_srcFormat = UtfConverter::SourceFormat::sfUTF32be;
        m_charSize = 4;
        prefixLen = 4;
        m_splitterOfs = 3;
        m_long_N = my_htonl(0x0000000a);
        m_long_R = my_htonl(0x0000000d);
    }
    else if (dataStart[0] == 0xFF && dataStart[1] == 0xFE && dataStart[2] == 0 && dataStart[3] == 0)
    {
        m_srcFormat = UtfConverter::SourceFormat::sfUTF32le;
        m_charSize = 4;
        prefixLen = 4;
        m_long_N = my_htonl(0x0a000000);
        m_long_R = my_htonl(0x0d000000);
    }
    else if (dataStart[0] == 0xFE && dataStart[1] == 0xFF)
    {
        m_srcFormat = UtfConverter::SourceFormat::sfUTF16be;
        m_charSize = 2;
        prefixLen = 2;
        m_splitterOfs = 1;
        m_short_N = my_htons(0x000a);
        m_short_R = my_htons(0x000d);
    }
    else if (dataStart[0] == 0xFF && dataStart[1] == 0xFE)
    {
        m_srcFormat = UtfConverter::SourceFormat::sfUTF16le;
        m_charSize = 2;
        prefixLen = 2;
        m_short_N = my_htons(0x0a00);
        m_short_R = my_htons(0x0d00);
    }
    else
    {
#ifdef _WIN32
        LTRACE(LT_INFO, 2, "Failed to auto-detect SRT encoding : falling back to the active code page");
        m_srcFormat = UtfConverter::SourceFormat::sfANSI;  // default value for win32
#else
        LTRACE(LT_INFO, 2, "Failed to auto-detect SRT encoding : falling back to UTF-8");
        m_srcFormat = UtfConverter::SourceFormat::sfUTF8;
#endif
    }
    return true;
}